

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O2

wchar_t create_filesystem_object(archive_write_disk *a)

{
  __mode_t __mode;
  byte *pbVar1;
  uint uVar2;
  int iVar3;
  wchar_t wVar4;
  char *pcVar5;
  wchar_t *pwVar6;
  dev_t __dev;
  wchar_t wVar7;
  archive_entry *entry;
  uint uVar8;
  uint __mode_00;
  
  pcVar5 = archive_entry_hardlink(a->entry);
  if (pcVar5 != (char *)0x0) {
    iVar3 = link(pcVar5,a->name);
    if (iVar3 != 0) {
      pwVar6 = __errno_location();
      if (*pwVar6 != L'\0') {
        return *pwVar6;
      }
    }
    if (a->filesize < 1) {
      a->todo = L'\0';
      a->deferred = L'\0';
      return L'\0';
    }
    wVar4 = open(a->name,0x80201);
    a->fd = wVar4;
    __archive_ensure_cloexec_flag(wVar4);
    if (L'\xffffffff' < a->fd) {
      return L'\0';
    }
    goto LAB_0043254a;
  }
  pcVar5 = archive_entry_symlink(a->entry);
  if (pcVar5 != (char *)0x0) {
    iVar3 = symlink(pcVar5,a->name);
    if (iVar3 == 0) {
      return L'\0';
    }
    goto LAB_0043254a;
  }
  uVar2 = a->mode;
  uVar8 = ~a->user_umask & uVar2;
  __mode_00 = uVar8 & 0x1ff;
  switch((uVar2 & 0xf000) - 0x1000 >> 0xc) {
  case 0:
    uVar8 = mkfifo(a->name,__mode_00);
    break;
  case 1:
    entry = a->entry;
    pcVar5 = a->name;
    __mode = __mode_00 + 0x2000;
    goto LAB_00432506;
  default:
    wVar4 = open(a->name,0x800c1,(ulong)__mode_00);
    a->fd = wVar4;
    __archive_ensure_cloexec_flag(wVar4);
    uVar8 = (uint)a->fd >> 0x1f;
    break;
  case 3:
    __mode_00 = uVar8 & 0x3d | 0x1c0;
    iVar3 = mkdir(a->name,__mode_00);
    if (iVar3 != 0) goto LAB_0043254a;
    wVar4 = a->todo;
    wVar7 = wVar4 & 4U | a->deferred;
    a->deferred = wVar7;
    if ((__mode_00 != (uVar2 & 0xfff)) || ((a->flags & L'\x02') != L'\0')) {
      a->deferred = wVar7 | wVar4 & 0x34000000U;
    }
    a->todo = wVar4 & 0xcbfffffb;
    goto LAB_0043255c;
  case 5:
    entry = a->entry;
    pcVar5 = a->name;
    __mode = __mode_00 + 0x6000;
LAB_00432506:
    __dev = archive_entry_rdev(entry);
    uVar8 = mknod(pcVar5,__mode,__dev);
  }
  if (uVar8 == 0) {
LAB_0043255c:
    wVar4 = L'\0';
    if (__mode_00 == (uVar2 & 0xfff)) {
      pbVar1 = (byte *)((long)&a->todo + 3);
      *pbVar1 = *pbVar1 & 0xcb;
    }
  }
  else {
LAB_0043254a:
    pwVar6 = __errno_location();
    wVar4 = *pwVar6;
  }
  return wVar4;
}

Assistant:

static int
create_filesystem_object(struct archive_write_disk *a)
{
	/* Create the entry. */
	const char *linkname;
	mode_t final_mode, mode;
	int r;

	/* We identify hard/symlinks according to the link names. */
	/* Since link(2) and symlink(2) don't handle modes, we're done here. */
	linkname = archive_entry_hardlink(a->entry);
	if (linkname != NULL) {
#if !HAVE_LINK
		return (EPERM);
#else
		r = link(linkname, a->name) ? errno : 0;
		/*
		 * New cpio and pax formats allow hardlink entries
		 * to carry data, so we may have to open the file
		 * for hardlink entries.
		 *
		 * If the hardlink was successfully created and
		 * the archive doesn't have carry data for it,
		 * consider it to be non-authoritative for meta data.
		 * This is consistent with GNU tar and BSD pax.
		 * If the hardlink does carry data, let the last
		 * archive entry decide ownership.
		 */
		if (r == 0 && a->filesize <= 0) {
			a->todo = 0;
			a->deferred = 0;
		} else if (r == 0 && a->filesize > 0) {
			a->fd = open(a->name,
				     O_WRONLY | O_TRUNC | O_BINARY | O_CLOEXEC);
			__archive_ensure_cloexec_flag(a->fd);
			if (a->fd < 0)
				r = errno;
		}
		return (r);
#endif
	}
	linkname = archive_entry_symlink(a->entry);
	if (linkname != NULL) {
#if HAVE_SYMLINK
		return symlink(linkname, a->name) ? errno : 0;
#else
		return (EPERM);
#endif
	}

	/*
	 * The remaining system calls all set permissions, so let's
	 * try to take advantage of that to avoid an extra chmod()
	 * call.  (Recall that umask is set to zero right now!)
	 */

	/* Mode we want for the final restored object (w/o file type bits). */
	final_mode = a->mode & 07777;
	/*
	 * The mode that will actually be restored in this step.  Note
	 * that SUID, SGID, etc, require additional work to ensure
	 * security, so we never restore them at this point.
	 */
	mode = final_mode & 0777 & ~a->user_umask;

	switch (a->mode & AE_IFMT) {
	default:
		/* POSIX requires that we fall through here. */
		/* FALLTHROUGH */
	case AE_IFREG:
		a->fd = open(a->name,
		    O_WRONLY | O_CREAT | O_EXCL | O_BINARY | O_CLOEXEC, mode);
		__archive_ensure_cloexec_flag(a->fd);
		r = (a->fd < 0);
		break;
	case AE_IFCHR:
#ifdef HAVE_MKNOD
		/* Note: we use AE_IFCHR for the case label, and
		 * S_IFCHR for the mknod() call.  This is correct.  */
		r = mknod(a->name, mode | S_IFCHR,
		    archive_entry_rdev(a->entry));
		break;
#else
		/* TODO: Find a better way to warn about our inability
		 * to restore a char device node. */
		return (EINVAL);
#endif /* HAVE_MKNOD */
	case AE_IFBLK:
#ifdef HAVE_MKNOD
		r = mknod(a->name, mode | S_IFBLK,
		    archive_entry_rdev(a->entry));
		break;
#else
		/* TODO: Find a better way to warn about our inability
		 * to restore a block device node. */
		return (EINVAL);
#endif /* HAVE_MKNOD */
	case AE_IFDIR:
		mode = (mode | MINIMUM_DIR_MODE) & MAXIMUM_DIR_MODE;
		r = mkdir(a->name, mode);
		if (r == 0) {
			/* Defer setting dir times. */
			a->deferred |= (a->todo & TODO_TIMES);
			a->todo &= ~TODO_TIMES;
			/* Never use an immediate chmod(). */
			/* We can't avoid the chmod() entirely if EXTRACT_PERM
			 * because of SysV SGID inheritance. */
			if ((mode != final_mode)
			    || (a->flags & ARCHIVE_EXTRACT_PERM))
				a->deferred |= (a->todo & TODO_MODE);
			a->todo &= ~TODO_MODE;
		}
		break;
	case AE_IFIFO:
#ifdef HAVE_MKFIFO
		r = mkfifo(a->name, mode);
		break;
#else
		/* TODO: Find a better way to warn about our inability
		 * to restore a fifo. */
		return (EINVAL);
#endif /* HAVE_MKFIFO */
	}

	/* All the system calls above set errno on failure. */
	if (r)
		return (errno);

	/* If we managed to set the final mode, we've avoided a chmod(). */
	if (mode == final_mode)
		a->todo &= ~TODO_MODE;
	return (0);
}